

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O0

void setupStateFeature(FeatureDescription *feature,string *name)

{
  Arena *pAVar1;
  FeatureType *pFVar2;
  StateFeatureType *pSVar3;
  ArrayFeatureType *pAVar4;
  string *name_local;
  FeatureDescription *feature_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&feature->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set(&feature->name_,name,pAVar1);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(feature);
  pSVar3 = CoreML::Specification::FeatureType::mutable_statetype(pFVar2);
  pAVar4 = CoreML::Specification::StateFeatureType::mutable_arraytype(pSVar3);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar4,ArrayFeatureType_ArrayDataType_FLOAT16);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(feature);
  pSVar3 = CoreML::Specification::FeatureType::mutable_statetype(pFVar2);
  pAVar4 = CoreML::Specification::StateFeatureType::mutable_arraytype(pSVar3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,1);
  return;
}

Assistant:

static void setupStateFeature(Specification::FeatureDescription *feature, const std::string& name) {
    feature->set_name(name);
    feature->mutable_type()->mutable_statetype()->mutable_arraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT16);
    feature->mutable_type()->mutable_statetype()->mutable_arraytype()->add_shape(1);
}